

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.cpp
# Opt level: O1

Vector * __thiscall Box::find_normal(Box *this,Vector *p)

{
  long lVar1;
  Vector *normal;
  Vector *in_RDI;
  long lVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  lVar1 = 0;
  dVar5 = INFINITY;
  lVar2 = -9;
  iVar3 = 0;
  do {
    dVar6 = this->d1[lVar2 + 2] * p->z + this->d1[lVar2] * p->x + this->d1[lVar2 + 1] * p->y;
    dVar8 = ABS(this->d1[lVar1] + dVar6);
    dVar7 = ABS(dVar6 + this->d2[lVar1]);
    dVar6 = dVar8;
    if (dVar5 <= dVar8) {
      dVar6 = dVar5;
    }
    iVar4 = (int)lVar1;
    if (dVar6 <= dVar7) {
      iVar4 = iVar3;
    }
    iVar3 = (int)lVar1;
    if (dVar5 <= dVar8) {
      iVar3 = iVar4;
    }
    dVar5 = dVar7;
    if (dVar6 <= dVar7) {
      dVar5 = dVar6;
    }
    lVar1 = lVar1 + 1;
    lVar2 = lVar2 + 3;
  } while (lVar2 != 0);
  dVar5 = this->n[iVar3].x;
  in_RDI->x = dVar5;
  dVar6 = this->n[iVar3].y;
  in_RDI->y = dVar6;
  dVar7 = this->n[iVar3].z;
  in_RDI->z = dVar7;
  if ((p->z - (this->center).z) * dVar7 +
      (p->x - (this->center).x) * dVar5 + (p->y - (this->center).y) * dVar6 < 0.0) {
    in_RDI->x = -dVar5;
    in_RDI->y = -dVar6;
    in_RDI->z = -dVar7;
  }
  return in_RDI;
}

Assistant:

Vector Box::find_normal( Vector& p )
{
    double MinDist = INFINITY;
    int index = 0;
    double d,Dist1,Dist2;
    Vector normal;
    int i;

    for( i = 0; i < 3; i++ )
    {
        d = p & n[i];
        Dist1 = fabs(d + d1[i]);
        Dist2 = fabs(d + d2[i]);

        if( Dist1 < MinDist )
        {
            MinDist = Dist1;
            index = i;
        }
        if( Dist2 < MinDist )
        {
            MinDist = Dist2;
            index = i;
        }
    }
    normal = n[index];
    if( ((p - center) & normal) < 0.0 )
        normal = -normal;

    return normal;
}